

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImageLine(gdImagePtr im,int x1,int y1,int x2,int y2,int color)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  double dVar20;
  int local_80;
  int local_5c;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  ulong local_38;
  
  y2_local = y2;
  x2_local = x2;
  y1_local = y1;
  x1_local = x1;
  if (color == -7) {
    iVar4 = im->AA_color;
    local_48 = y2;
    local_44 = x2;
    local_40 = y1;
    local_3c = x1;
    if (im->trueColor == 0) {
      gdImageLine(im,x1,y1,x2,y2,iVar4);
    }
    else {
      iVar11 = im->thick;
      iVar2 = clip_1d(&local_3c,&local_40,&local_44,&local_48,im->cx1,im->cx2);
      if ((iVar2 != 0) &&
         (iVar3 = clip_1d(&local_40,&local_3c,&local_48,&local_44,im->cy1,im->cy2), iVar2 = local_3c
         , iVar12 = local_40, iVar8 = local_44, iVar17 = local_48, iVar3 != 0)) {
        if (local_40 == local_48 && local_3c == local_44) {
          gdImageSetPixel(im,local_44,local_48,iVar4);
        }
        else {
          uVar13 = local_44 - local_3c;
          uVar15 = local_48 - local_40;
          uVar14 = -uVar15;
          if (0 < (int)uVar15) {
            uVar14 = uVar15;
          }
          uVar1 = -uVar13;
          if (0 < (int)uVar13) {
            uVar1 = uVar13;
          }
          dVar20 = atan2((double)(int)uVar15,(double)(int)uVar13);
          if (uVar14 < uVar1) {
            dVar20 = cos(dVar20);
          }
          else {
            dVar20 = sin(dVar20);
          }
          if ((dVar20 != 0.0) || (NAN(dVar20))) {
            iVar11 = (int)((double)iVar11 / ABS(dVar20));
          }
          else {
            iVar11 = 1;
          }
          iVar11 = iVar11 + (uint)(iVar11 == 0);
          iVar3 = iVar2 - iVar8;
          if (iVar3 == 0) {
            gdImageVLine(im,iVar8,iVar12,iVar17,iVar4);
          }
          else {
            iVar10 = iVar12 - iVar17;
            if (iVar10 == 0) {
              gdImageHLine(im,iVar17,iVar2,iVar8,iVar4);
            }
            else {
              lVar6 = (long)(int)uVar13;
              lVar9 = (long)(int)uVar15;
              if (uVar14 < uVar1) {
                iVar5 = iVar8;
                if ((int)uVar13 < 0) {
                  lVar6 = (long)iVar3;
                  lVar9 = (long)iVar10;
                  iVar5 = iVar2;
                  iVar2 = iVar8;
                  iVar12 = iVar17;
                }
                local_38 = (long)iVar11 / -2 & 0xffffffff;
                lVar7 = 0;
                for (lVar19 = (long)iVar2; lVar19 <= iVar5; lVar19 = lVar19 + 1) {
                  iVar17 = iVar12 + (int)local_38;
                  iVar2 = iVar17 + iVar11;
                  uVar14 = (uint)((ulong)lVar7 >> 8) & 0xff;
                  while (iVar17 < iVar2) {
                    gdImageSetAAPixelColor(im,(int)lVar19,iVar17,iVar4,uVar14);
                    iVar17 = iVar17 + 1;
                    gdImageSetAAPixelColor(im,(int)lVar19,iVar17,iVar4,uVar14 ^ 0xff);
                  }
                  lVar7 = lVar7 + (lVar9 << 0x10) / lVar6;
                  if (lVar7 < 0x10000) {
                    if (lVar7 < 0) {
                      lVar7 = lVar7 + 0x10000;
                      iVar12 = iVar12 + -1;
                    }
                  }
                  else {
                    lVar7 = lVar7 + -0x10000;
                    iVar12 = iVar12 + 1;
                  }
                }
              }
              else {
                iVar5 = iVar12;
                if ((int)uVar15 < 0) {
                  lVar6 = (long)iVar3;
                  lVar9 = (long)iVar10;
                  iVar5 = iVar17;
                  iVar17 = iVar12;
                  iVar2 = iVar8;
                }
                local_38 = (long)iVar11 / -2 & 0xffffffff;
                lVar7 = 0;
                for (lVar19 = (long)iVar5; lVar19 <= iVar17; lVar19 = lVar19 + 1) {
                  iVar12 = (int)local_38 + iVar2;
                  iVar8 = iVar12 + iVar11;
                  uVar14 = (uint)((ulong)lVar7 >> 8) & 0xff;
                  while (iVar12 < iVar8) {
                    gdImageSetAAPixelColor(im,iVar12,(int)lVar19,iVar4,uVar14);
                    iVar12 = iVar12 + 1;
                    gdImageSetAAPixelColor(im,iVar12,(int)lVar19,iVar4,uVar14 ^ 0xff);
                  }
                  lVar7 = lVar7 + (lVar6 << 0x10) / lVar9;
                  if (lVar7 < 0x10000) {
                    if (lVar7 < 0) {
                      lVar7 = lVar7 + 0x10000;
                      iVar2 = iVar2 + -1;
                    }
                  }
                  else {
                    lVar7 = lVar7 + -0x10000;
                    iVar2 = iVar2 + 1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    iVar4 = clip_1d(&x1_local,&y1_local,&x2_local,&y2_local,im->cx1,im->cx2);
    if ((iVar4 != 0) &&
       (iVar8 = clip_1d(&y1_local,&x1_local,&y2_local,&x2_local,im->cy1,im->cy2), iVar17 = x1_local,
       iVar2 = y1_local, iVar4 = x2_local, iVar11 = y2_local, iVar8 != 0)) {
      uVar13 = x2_local - x1_local;
      uVar14 = -uVar13;
      if (0 < (int)uVar13) {
        uVar14 = uVar13;
      }
      uVar15 = y2_local - y1_local;
      uVar13 = -uVar15;
      if (0 < (int)uVar15) {
        uVar13 = uVar15;
      }
      iVar8 = x2_local - x1_local;
      if (iVar8 == 0) {
        gdImageVLine(im,x2_local,y1_local,y2_local,color);
        return;
      }
      if (y2_local == y1_local) {
        gdImageHLine(im,y2_local,x1_local,x2_local,color);
        return;
      }
      local_38 = CONCAT44(local_38._4_4_,uVar15);
      local_80 = y1_local;
      iVar12 = im->thick;
      dVar20 = atan2((double)(int)uVar13,(double)(int)uVar14);
      if (uVar13 < uVar14 || uVar13 - uVar14 == 0) {
        dVar20 = cos(dVar20);
        iVar12 = (int)((double)iVar12 / dVar20);
        iVar12 = iVar12 + (uint)(iVar12 == 0);
        iVar8 = 1;
        if (dVar20 != 0.0) {
          iVar8 = iVar12;
        }
        if (NAN(dVar20)) {
          iVar8 = iVar12;
        }
        iVar12 = uVar13 * 2;
        if (iVar4 < iVar17) {
          local_5c = -1;
          iVar3 = iVar4;
          iVar2 = iVar11;
          iVar4 = iVar17;
        }
        else {
          local_5c = 1;
          iVar3 = iVar17;
        }
        iVar17 = iVar12 - uVar14;
        iVar11 = (uVar13 - uVar14) * 2;
        iVar10 = iVar8 / 2;
        iVar5 = iVar2 - iVar10;
        iVar16 = iVar5 + iVar8;
        for (; iVar5 < iVar16; iVar5 = iVar5 + 1) {
          gdImageSetPixel(im,iVar3,iVar5,color);
        }
        if (local_5c * (int)local_38 < 1) {
          while (iVar3 != iVar4) {
            iVar3 = iVar3 + 1;
            iVar5 = iVar12;
            if (-1 < iVar17) {
              iVar5 = iVar11;
            }
            iVar2 = iVar2 - (uint)(-1 < iVar17);
            iVar18 = iVar2 - iVar10;
            iVar16 = iVar18 + iVar8;
            for (; iVar18 < iVar16; iVar18 = iVar18 + 1) {
              gdImageSetPixel(im,iVar3,iVar18,color);
            }
            iVar17 = iVar17 + iVar5;
          }
        }
        else {
          while (iVar3 != iVar4) {
            iVar3 = iVar3 + 1;
            iVar5 = iVar12;
            if (-1 < iVar17) {
              iVar5 = iVar11;
            }
            iVar2 = iVar2 + (uint)(-1 < iVar17);
            iVar18 = iVar2 - iVar10;
            iVar16 = iVar18 + iVar8;
            for (; iVar18 < iVar16; iVar18 = iVar18 + 1) {
              gdImageSetPixel(im,iVar3,iVar18,color);
            }
            iVar17 = iVar17 + iVar5;
          }
        }
      }
      else {
        dVar20 = sin(dVar20);
        iVar10 = (int)((double)iVar12 / dVar20);
        iVar10 = iVar10 + (uint)(iVar10 == 0);
        iVar12 = 1;
        iVar3 = 1;
        if (dVar20 != 0.0) {
          iVar3 = iVar10;
        }
        if (NAN(dVar20)) {
          iVar3 = iVar10;
        }
        iVar10 = uVar14 * 2;
        if (iVar11 < iVar2) {
          iVar12 = -1;
          iVar17 = iVar4;
          iVar2 = iVar11;
        }
        else {
          local_80 = iVar11;
        }
        iVar5 = iVar10 - uVar13;
        iVar4 = (uVar14 - uVar13) * 2;
        iVar11 = iVar3 / 2;
        iVar18 = iVar17 - iVar11;
        iVar16 = iVar18 + iVar3;
        for (; iVar18 < iVar16; iVar18 = iVar18 + 1) {
          gdImageSetPixel(im,iVar18,iVar2,color);
        }
        if (iVar12 * iVar8 < 1) {
          while (iVar2 != local_80) {
            iVar2 = iVar2 + 1;
            iVar8 = iVar10;
            if (-1 < iVar5) {
              iVar8 = iVar4;
            }
            iVar17 = iVar17 - (uint)(-1 < iVar5);
            iVar16 = iVar17 - iVar11;
            iVar12 = iVar16 + iVar3;
            for (; iVar16 < iVar12; iVar16 = iVar16 + 1) {
              gdImageSetPixel(im,iVar16,iVar2,color);
            }
            iVar5 = iVar5 + iVar8;
          }
        }
        else {
          while (iVar2 != local_80) {
            iVar2 = iVar2 + 1;
            iVar8 = iVar10;
            if (-1 < iVar5) {
              iVar8 = iVar4;
            }
            iVar17 = iVar17 + (uint)(-1 < iVar5);
            iVar16 = iVar17 - iVar11;
            iVar12 = iVar16 + iVar3;
            for (; iVar16 < iVar12; iVar16 = iVar16 + 1) {
              gdImageSetPixel(im,iVar16,iVar2,color);
            }
            iVar5 = iVar5 + iVar8;
          }
        }
      }
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageLine (gdImagePtr im, int x1, int y1, int x2, int y2, int color)
{
	int dx, dy, incr1, incr2, d, x, y, xend, yend, xdirflag, ydirflag;
	int wid;
	int w, wstart;
	int thick;

	if (color == gdAntiAliased) {
		/*
		  gdAntiAliased passed as color: use the much faster, much cheaper
		  and equally attractive gdImageAALine implementation. That
		  clips too, so don't clip twice.
		*/
		gdImageAALine(im, x1, y1, x2, y2, im->AA_color);
		return;
	}
	/* 2.0.10: Nick Atty: clip to edges of drawing rectangle, return if no
	   points need to be drawn. 2.0.26, TBB: clip to edges of clipping
	   rectangle. We were getting away with this because gdImageSetPixel
	   is used for actual drawing, but this is still more efficient and opens
	   the way to skip per-pixel bounds checking in the future. */

	if (clip_1d (&x1, &y1, &x2, &y2, im->cx1, im->cx2) == 0)
		return;
	if (clip_1d (&y1, &x1, &y2, &x2, im->cy1, im->cy2) == 0)
		return;
	thick = im->thick;

	dx = abs (x2 - x1);
	dy = abs (y2 - y1);

	if (dx == 0) {
		gdImageVLine(im, x1, y1, y2, color);
		return;
	} else if (dy == 0) {
		gdImageHLine(im, y1, x1, x2, color);
		return;
	}

	if (dy <= dx) {
		/* More-or-less horizontal. use wid for vertical stroke */
		/* Doug Claar: watch out for NaN in atan2 (2.0.5) */
		
		/* 2.0.12: Michael Schwartz: divide rather than multiply;
			  TBB: but watch out for /0! */
		double ac = cos (atan2 (dy, dx));
		if (ac != 0) {
			wid = thick / ac;
		} else {
			wid = 1;
		}
		if (wid == 0) {
			wid = 1;
		}
		d = 2 * dy - dx;
		incr1 = 2 * dy;
		incr2 = 2 * (dy - dx);
		if (x1 > x2) {
			x = x2;
			y = y2;
			ydirflag = (-1);
			xend = x1;
		} else {
			x = x1;
			y = y1;
			ydirflag = 1;
			xend = x2;
		}

		/* Set up line thickness */
		wstart = y - wid / 2;
		for (w = wstart; w < wstart + wid; w++)
			gdImageSetPixel (im, x, w, color);

		if (((y2 - y1) * ydirflag) > 0) {
			while (x < xend) {
				x++;
				if (d < 0) {
					d += incr1;
				} else {
					y++;
					d += incr2;
				}
				wstart = y - wid / 2;
				for (w = wstart; w < wstart + wid; w++)
					gdImageSetPixel (im, x, w, color);
			}
		} else {
			while (x < xend) {
				x++;
				if (d < 0) {
					d += incr1;
				} else {
					y--;
					d += incr2;
				}
				wstart = y - wid / 2;
				for (w = wstart; w < wstart + wid; w++)
					gdImageSetPixel (im, x, w, color);
			}
		}
	} else {
		/* More-or-less vertical. use wid for horizontal stroke */
		/* 2.0.12: Michael Schwartz: divide rather than multiply;
		   TBB: but watch out for /0! */
		double as = sin (atan2 (dy, dx));
		if (as != 0) {
			wid = thick / as;
		} else {
			wid = 1;
		}
		if (wid == 0)
			wid = 1;

		d = 2 * dx - dy;
		incr1 = 2 * dx;
		incr2 = 2 * (dx - dy);
		if (y1 > y2) {
			y = y2;
			x = x2;
			yend = y1;
			xdirflag = (-1);
		} else {
			y = y1;
			x = x1;
			yend = y2;
			xdirflag = 1;
		}

		/* Set up line thickness */
		wstart = x - wid / 2;
		for (w = wstart; w < wstart + wid; w++)
			gdImageSetPixel (im, w, y, color);

		if (((x2 - x1) * xdirflag) > 0) {
			while (y < yend) {
				y++;
				if (d < 0) {
					d += incr1;
				} else {
					x++;
					d += incr2;
				}
				wstart = x - wid / 2;
				for (w = wstart; w < wstart + wid; w++)
					gdImageSetPixel (im, w, y, color);
			}
		} else {
			while (y < yend) {
				y++;
				if (d < 0) {
					d += incr1;
				} else {
					x--;
					d += incr2;
				}
				wstart = x - wid / 2;
				for (w = wstart; w < wstart + wid; w++)
					gdImageSetPixel (im, w, y, color);
			}
		}
	}

}